

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void fe_storage_cmov_test(void)

{
  int iVar1;
  secp256k1_fe_storage a;
  secp256k1_fe_storage r;
  secp256k1_fe_storage local_40;
  secp256k1_fe_storage local_20;
  
  local_20.n[0] = 0xffffffffffffffff;
  local_20.n[1] = 0xffffffffffffffff;
  local_20.n[2] = 0xffffffffffffffff;
  local_20.n[3] = 0xffffffffffffffff;
  memset(&local_40,0,0x20);
  secp256k1_fe_storage_cmov(&local_20,&local_40,0);
  iVar1 = secp256k1_memcmp_var(&local_20,&fe_storage_cmov_test::max,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d97,"test condition failed: secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0");
    abort();
  }
  local_20.n[0] = 0;
  local_20.n[1] = 0;
  local_20.n[2] = 0;
  local_20.n[3] = 0;
  local_40.n[0] = 0xffffffffffffffff;
  local_40.n[1] = 0xffffffffffffffff;
  local_40.n[2] = 0xffffffffffffffff;
  local_40.n[3] = 0xffffffffffffffff;
  secp256k1_fe_storage_cmov(&local_20,&local_40,1);
  iVar1 = secp256k1_memcmp_var(&local_20,&fe_storage_cmov_test::max,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d9b,"test condition failed: secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0");
    abort();
  }
  local_40.n[0] = 0;
  local_40.n[1] = 0;
  local_40.n[2] = 0;
  local_40.n[3] = 0;
  secp256k1_fe_storage_cmov(&local_20,&local_40,1);
  iVar1 = secp256k1_memcmp_var(&local_20,&fe_storage_cmov_test::zero,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d9f,"test condition failed: secp256k1_memcmp_var(&r, &zero, sizeof(r)) == 0");
    abort();
  }
  local_40.n[0] = 1;
  local_40.n[1] = 0;
  local_40.n[2] = 0;
  local_40.n[3] = 0;
  secp256k1_fe_storage_cmov(&local_20,&local_40,1);
  iVar1 = secp256k1_memcmp_var(&local_20,&fe_storage_cmov_test::one,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1da3,"test condition failed: secp256k1_memcmp_var(&r, &one, sizeof(r)) == 0");
    abort();
  }
  local_20.n[0] = 1;
  local_20.n[1] = 0;
  local_20.n[2] = 0;
  local_20.n[3] = 0;
  local_40.n[0] = 0;
  local_40.n[1] = 0;
  local_40.n[2] = 0;
  local_40.n[3] = 0;
  secp256k1_fe_storage_cmov(&local_20,&local_40,0);
  iVar1 = secp256k1_memcmp_var(&local_20,&fe_storage_cmov_test::one,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1da7,"test condition failed: secp256k1_memcmp_var(&r, &one, sizeof(r)) == 0");
    abort();
  }
  return;
}

Assistant:

static void fe_storage_cmov_test(void) {
    static const secp256k1_fe_storage zero = SECP256K1_FE_STORAGE_CONST(0, 0, 0, 0, 0, 0, 0, 0);
    static const secp256k1_fe_storage one = SECP256K1_FE_STORAGE_CONST(0, 0, 0, 0, 0, 0, 0, 1);
    static const secp256k1_fe_storage max = SECP256K1_FE_STORAGE_CONST(
        0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL,
        0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL
    );
    secp256k1_fe_storage r = max;
    secp256k1_fe_storage a = zero;

    secp256k1_fe_storage_cmov(&r, &a, 0);
    CHECK(secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0);

    r = zero; a = max;
    secp256k1_fe_storage_cmov(&r, &a, 1);
    CHECK(secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0);

    a = zero;
    secp256k1_fe_storage_cmov(&r, &a, 1);
    CHECK(secp256k1_memcmp_var(&r, &zero, sizeof(r)) == 0);

    a = one;
    secp256k1_fe_storage_cmov(&r, &a, 1);
    CHECK(secp256k1_memcmp_var(&r, &one, sizeof(r)) == 0);

    r = one; a = zero;
    secp256k1_fe_storage_cmov(&r, &a, 0);
    CHECK(secp256k1_memcmp_var(&r, &one, sizeof(r)) == 0);
}